

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinDynamics.cpp
# Opt level: O3

void __thiscall OpenMD::LangevinDynamics::moveB(LangevinDynamics *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  StuntDouble *this_00;
  Snapshot *pSVar5;
  uint i_3;
  Molecule *pMVar6;
  pointer ppSVar7;
  uint i_1;
  long lVar8;
  undefined1 *puVar9;
  long lVar10;
  pointer ppSVar11;
  Vector<double,_3U> result;
  MoleculeIterator i;
  Vector3d Tb;
  Vector3d local_c8;
  double local_a8 [4];
  double local_88 [3];
  MoleculeIterator local_70;
  Vector3d local_68;
  double local_48 [3];
  
  local_70._M_node = (_Base_ptr)0x0;
  local_68.super_Vector<double,_3U>.data_[2] = 0.0;
  local_68.super_Vector<double,_3U>.data_[0] = 0.0;
  local_68.super_Vector<double,_3U>.data_[1] = 0.0;
  pMVar6 = SimInfo::beginMolecule
                     ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_70);
  if (pMVar6 != (Molecule *)0x0) {
    do {
      ppSVar11 = (pMVar6->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppSVar7 = (pMVar6->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppSVar11 != ppSVar7) {
        do {
          this_00 = *ppSVar11;
          if (this_00 == (StuntDouble *)0x0) break;
          pSVar5 = this_00->snapshotMan_->currentSnapshot_;
          lVar8 = *(long *)((long)&(pSVar5->atomData).velocity.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + this_00->storage_);
          lVar10 = (long)this_00->localIndex_ * 0x18;
          local_88[2] = (double)*(undefined8 *)(lVar8 + 0x10 + lVar10);
          pdVar1 = (double *)(lVar8 + lVar10);
          local_88[0] = *pdVar1;
          local_88[1] = pdVar1[1];
          lVar8 = *(long *)((long)&(pSVar5->atomData).force.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + this_00->storage_);
          local_48[2] = (double)*(undefined8 *)(lVar8 + 0x10 + lVar10);
          pdVar1 = (double *)(lVar8 + lVar10);
          local_48[0] = *pdVar1;
          local_48[1] = pdVar1[1];
          dVar2 = (this->super_VelocityVerletIntegrator).super_Integrator.dt2;
          dVar3 = this_00->mass_;
          local_c8.super_Vector<double,_3U>.data_[0] = 0.0;
          local_c8.super_Vector<double,_3U>.data_[1] = 0.0;
          local_c8.super_Vector<double,_3U>.data_[2] = 0.0;
          lVar8 = 0;
          do {
            local_c8.super_Vector<double,_3U>.data_[lVar8] =
                 local_48[lVar8] * (dVar2 / dVar3) * 0.0004184;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          lVar8 = 0;
          do {
            local_88[lVar8] = local_c8.super_Vector<double,_3U>.data_[lVar8] + local_88[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          pSVar5 = this_00->snapshotMan_->currentSnapshot_;
          lVar10 = (long)this_00->localIndex_;
          lVar8 = *(long *)((long)&(pSVar5->atomData).velocity.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + this_00->storage_);
          *(double *)(lVar8 + 0x10 + lVar10 * 0x18) = local_88[2];
          pdVar1 = (double *)(lVar8 + lVar10 * 0x18);
          *pdVar1 = local_88[0];
          pdVar1[1] = local_88[1];
          if (this_00->objType_ - otDAtom < 2) {
            puVar9 = (undefined1 *)
                     (lVar10 * 0x18 +
                     *(long *)((long)&(pSVar5->atomData).torque.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + this_00->storage_)
                     );
            local_c8.super_Vector<double,_3U>.data_[0] = 0.0;
            local_c8.super_Vector<double,_3U>.data_[1] = 0.0;
            local_c8.super_Vector<double,_3U>.data_[2] = 0.0;
            if ((Vector3d *)puVar9 != &local_c8) {
              lVar8 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar8] = *(double *)(puVar9 + lVar8 * 8);
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
            }
            StuntDouble::lab2Body(&local_68,this_00,&local_c8);
            lVar8 = *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).
                                     angularMomentum.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + this_00->storage_);
            local_a8[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)this_00->localIndex_ * 0x18);
            pdVar1 = (double *)(lVar8 + (long)this_00->localIndex_ * 0x18);
            local_a8[0] = *pdVar1;
            local_a8[1] = pdVar1[1];
            dVar2 = (this->super_VelocityVerletIntegrator).super_Integrator.dt2;
            local_c8.super_Vector<double,_3U>.data_[0] = 0.0;
            local_c8.super_Vector<double,_3U>.data_[1] = 0.0;
            local_c8.super_Vector<double,_3U>.data_[2] = 0.0;
            lVar8 = 0;
            do {
              local_c8.super_Vector<double,_3U>.data_[lVar8] =
                   local_68.super_Vector<double,_3U>.data_[lVar8] * dVar2 * 0.0004184;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 3);
            lVar8 = 0;
            do {
              local_a8[lVar8] = local_c8.super_Vector<double,_3U>.data_[lVar8] + local_a8[lVar8];
              lVar8 = lVar8 + 1;
            } while (lVar8 != 3);
            iVar4 = this_00->localIndex_;
            lVar8 = *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).
                                     angularMomentum.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + this_00->storage_);
            *(double *)(lVar8 + 0x10 + (long)iVar4 * 0x18) = local_a8[2];
            pdVar1 = (double *)(lVar8 + (long)iVar4 * 0x18);
            *pdVar1 = local_a8[0];
            pdVar1[1] = local_a8[1];
            ppSVar7 = (pMVar6->integrableObjects_).
                      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          ppSVar11 = ppSVar11 + 1;
        } while (ppSVar11 != ppSVar7);
      }
      pMVar6 = SimInfo::nextMolecule
                         ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_70);
    } while (pMVar6 != (Molecule *)0x0);
  }
  (*((this->super_VelocityVerletIntegrator).super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[6])();
  Rattle::constraintB((this->super_VelocityVerletIntegrator).super_Integrator.rattle_);
  return;
}

Assistant:

void LangevinDynamics::moveB() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d vel;
    Vector3d frc;
    Vector3d Tb;
    Vector3d ji;
    RealType mass;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        vel  = sd->getVel();
        frc  = sd->getFrc();
        mass = sd->getMass();

        // velocity half step
        vel += (dt2 / mass * Constants::energyConvert) * frc;

        sd->setVel(vel);

        if (sd->isDirectional()) {
          // get and convert the torque to body frame

          Tb = sd->lab2Body(sd->getTrq());

          // get the angular momentum, and propagate a half step

          ji = sd->getJ();

          ji += (dt2 * Constants::energyConvert) * Tb;

          sd->setJ(ji);
        }
      }
    }  // end for(mol = info_->beginMolecule(i))

    flucQ_->moveB();
    rattle_->constraintB();
  }